

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
solitaire::LayoutTests_getFoundationPilePosition_Test::TestBody
          (LayoutTests_getFoundationPilePosition_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_180;
  Message local_178 [2];
  runtime_error *anon_var_0;
  type e;
  uint local_134;
  PileId local_130;
  byte local_129;
  undefined1 auStack_128 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  AssertHelper local_100;
  Message local_f8;
  uint local_f0;
  PileId local_ec;
  Position local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  uint local_c0;
  PileId local_bc;
  Position local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  uint local_90;
  PileId local_8c;
  Position local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  uint local_50;
  PileId local_4c;
  Position local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Position pilePosition4;
  Position pilePosition3;
  Position pilePosition2;
  Position pilePosition1;
  LayoutTests_getFoundationPilePosition_Test *this_local;
  
  pilePosition2.x = 0x11b;
  pilePosition2.y = 0x1e;
  pilePosition3.x = 0x174;
  pilePosition3.y = 0x1e;
  pilePosition4.x = 0x1cd;
  pilePosition4.y = 0x1e;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x1e00000226;
  local_50 = 0;
  piles::PileId::PileId(&local_4c,&local_50);
  local_48 = Layout::getFoundationPilePosition(&local_4c);
  testing::internal::EqHelper::
  Compare<solitaire::geometry::Position,_solitaire::geometry::Position,_nullptr>
            ((EqHelper *)local_40,"Layout::getFoundationPilePosition(PileId {0})","pilePosition1",
             &local_48,&pilePosition2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_90 = 1;
  piles::PileId::PileId(&local_8c,&local_90);
  local_88 = Layout::getFoundationPilePosition(&local_8c);
  testing::internal::EqHelper::
  Compare<solitaire::geometry::Position,_solitaire::geometry::Position,_nullptr>
            ((EqHelper *)local_80,"Layout::getFoundationPilePosition(PileId {1})","pilePosition2",
             &local_88,&pilePosition3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_c0 = 2;
  piles::PileId::PileId(&local_bc,&local_c0);
  local_b8 = Layout::getFoundationPilePosition(&local_bc);
  testing::internal::EqHelper::
  Compare<solitaire::geometry::Position,_solitaire::geometry::Position,_nullptr>
            ((EqHelper *)local_b0,"Layout::getFoundationPilePosition(PileId {2})","pilePosition3",
             &local_b8,&pilePosition4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_f0 = 3;
  piles::PileId::PileId(&local_ec,&local_f0);
  local_e8 = Layout::getFoundationPilePosition(&local_ec);
  testing::internal::EqHelper::
  Compare<solitaire::geometry::Position,_solitaire::geometry::Position,_nullptr>
            ((EqHelper *)local_e0,"Layout::getFoundationPilePosition(PileId {3})","pilePosition4",
             &local_e8,(Position *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_128[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffed9 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_128);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_128);
  if (bVar1) {
    local_129 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_134 = 4;
      piles::PileId::PileId(&local_130,&local_134);
      register0x00000000 = Layout::getFoundationPilePosition(&local_130);
    }
    if ((local_129 & 1) != 0) goto LAB_001af1cf;
    std::__cxx11::string::operator=
              ((string *)auStack_128,
               "Expected: Layout::getFoundationPilePosition(PileId {4}) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_178);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
             ,0x15,pcVar2);
  testing::internal::AssertHelper::operator=(&local_180,local_178);
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  testing::Message::~Message(local_178);
LAB_001af1cf:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_128);
  return;
}

Assistant:

TEST(LayoutTests, getFoundationPilePosition) {
    Position pilePosition1 {283, 30};
    Position pilePosition2 {372, 30};
    Position pilePosition3 {461, 30};
    Position pilePosition4 {550, 30};

    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {0}), pilePosition1);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {1}), pilePosition2);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {2}), pilePosition3);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {3}), pilePosition4);
    EXPECT_THROW(Layout::getFoundationPilePosition(PileId {4}), std::runtime_error);
}